

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O3

int roslz4_buffToBuffCompress
              (char *input,uint input_size,char *output,uint *output_size,int block_size_id)

{
  uint uVar1;
  void *pvVar2;
  roslz4_stream stream;
  roslz4_stream local_50;
  
  local_50.output_left = *output_size;
  local_50.input_next = input;
  local_50.input_left = input_size;
  local_50.output_next = output;
  uVar1 = streamStateAlloc(&local_50);
  if ((-1 < (int)uVar1) && (uVar1 = 0xfffffffc, (block_size_id & 0xfffffffcU) == 4)) {
    *(undefined4 *)((long)local_50.state + 0x1c) = 0;
    uVar1 = 0x100 << ((char)block_size_id * '\x02' & 0x1fU);
    *(uint *)((long)local_50.state + 0x18) = uVar1;
    local_50.block_size_id = block_size_id;
    pvVar2 = malloc((ulong)uVar1);
    *(void **)((long)local_50.state + 0x10) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      uVar1 = 0xfffffffb;
    }
    else {
      uVar1 = 0;
      do {
        if ((uVar1 == 2) || (local_50.input_left < 1)) {
          *output_size = *output_size - local_50.output_left;
          streamStateFree(&local_50);
          return -(uint)(uVar1 != 2 || local_50.input_left != 0);
        }
        uVar1 = roslz4_compress(&local_50,1);
      } while (uVar1 < 0xfffffffe);
    }
  }
  streamStateFree(&local_50);
  return uVar1;
}

Assistant:

int roslz4_buffToBuffCompress(char *input, unsigned int input_size,
                              char *output, unsigned int *output_size,
                              int block_size_id) {
  roslz4_stream stream;
  stream.input_next = input;
  stream.input_left = input_size;
  stream.output_next = output;
  stream.output_left = *output_size;

  int ret;
  ret = roslz4_compressStart(&stream, block_size_id);
  if (ret != ROSLZ4_OK) {
    roslz4_compressEnd(&stream);
    return ret;
  }

  while (stream.input_left > 0 && ret != ROSLZ4_STREAM_END) {
    ret = roslz4_compress(&stream, ROSLZ4_FINISH);
    if (ret == ROSLZ4_ERROR || ret == ROSLZ4_OUTPUT_SMALL) {
      roslz4_compressEnd(&stream);
      return ret;
    }
  }

  *output_size = *output_size - stream.output_left;
  roslz4_compressEnd(&stream);

  if (stream.input_left == 0 && ret == ROSLZ4_STREAM_END) {
    return ROSLZ4_OK; // Success
  } else {
    return ROSLZ4_ERROR; // User did not provide exact buffer
  }
}